

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

PatternList *
parse_argv(Tokens *tokens,vector<docopt::Option,_std::allocator<docopt::Option>_> *options,
          bool options_first)

{
  __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  __first;
  __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  __first_00;
  bool bVar1;
  char *pcVar2;
  byte in_CL;
  PatternList *in_RDI;
  PatternList *parsed_1;
  PatternList *parsed;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *in_stack_00000170;
  Tokens *in_stack_00000178;
  string *token;
  PatternList *ret;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *in_stack_000002a0;
  Tokens *in_stack_000002a8;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  in_stack_fffffffffffffe20;
  back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  in_stack_fffffffffffffe38;
  __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  byte in_stack_fffffffffffffe4f;
  string local_170 [48];
  string local_140 [48];
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *local_110;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *local_108;
  shared_ptr<docopt::Pattern> *local_100;
  shared_ptr<docopt::Pattern> *local_f8;
  undefined1 local_f0 [24];
  undefined1 *local_d8;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *local_d0;
  shared_ptr<docopt::Pattern> *local_c8;
  shared_ptr<docopt::Pattern> *local_c0;
  shared_ptr<docopt::Pattern> *local_b8;
  undefined1 local_b0 [24];
  undefined1 *local_98;
  allocator local_89;
  string local_88 [32];
  string local_68 [48];
  string *local_38;
  undefined1 local_1a;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)0x2b9eb9);
  while (bVar1 = Tokens::operator_cast_to_bool((Tokens *)in_stack_fffffffffffffe20.container), bVar1
        ) {
    local_38 = Tokens::current_abi_cxx11_
                         ((Tokens *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe20.container,
                            (char *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    if (bVar1) {
      while (bVar1 = Tokens::operator_cast_to_bool((Tokens *)in_stack_fffffffffffffe20.container),
            bVar1) {
        Tokens::pop_abi_cxx11_((Tokens *)in_stack_fffffffffffffe28.container);
        std::make_shared<docopt::Argument,char_const(&)[1],std::__cxx11::string>
                  ((char (*) [1])CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe40._M_current);
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        emplace_back<std::shared_ptr<docopt::Argument>>
                  ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                   (shared_ptr<docopt::Argument> *)in_stack_fffffffffffffe28.container);
        std::shared_ptr<docopt::Argument>::~shared_ptr((shared_ptr<docopt::Argument> *)0x2b9f8d);
        std::__cxx11::string::~string(local_68);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"--",&local_89);
      in_stack_fffffffffffffe4f =
           anon_unknown.dwarf_15e08f::starts_with
                     ((string *)in_stack_fffffffffffffe38.container,
                      (string *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      if ((in_stack_fffffffffffffe4f & 1) == 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        if ((*pcVar2 == '-') &&
           (in_stack_fffffffffffffe37 =
                 std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffe20.container,
                                 (char *)CONCAT17(in_stack_fffffffffffffe1f,
                                                  in_stack_fffffffffffffe18)),
           (bool)in_stack_fffffffffffffe37)) {
          parse_short(in_stack_00000178,in_stack_00000170);
          local_d8 = local_f0;
          local_f8 = (shared_ptr<docopt::Pattern> *)
                     std::
                     vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ::begin((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                              *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
          local_100 = (shared_ptr<docopt::Pattern> *)
                      std::
                      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ::end((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
          in_stack_fffffffffffffe28 =
               std::
               back_inserter<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                         ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                           *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
          __first_00._M_current._7_1_ = in_stack_fffffffffffffe4f;
          __first_00._M_current._0_7_ = in_stack_fffffffffffffe48;
          local_108 = (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       *)in_stack_fffffffffffffe28;
          in_stack_fffffffffffffe20 =
               std::
               move<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,std::back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                         (__first_00,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          local_110 = (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       *)in_stack_fffffffffffffe20;
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
        }
        else if ((local_19 & 1) == 0) {
          Tokens::pop_abi_cxx11_((Tokens *)in_stack_fffffffffffffe28.container);
          std::make_shared<docopt::Argument,char_const(&)[1],std::__cxx11::string>
                    ((char (*) [1])CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe40._M_current);
          std::
          vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
          ::emplace_back<std::shared_ptr<docopt::Argument>>
                    ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                     (shared_ptr<docopt::Argument> *)in_stack_fffffffffffffe28.container);
          std::shared_ptr<docopt::Argument>::~shared_ptr((shared_ptr<docopt::Argument> *)0x2ba3ed);
          std::__cxx11::string::~string(local_170);
        }
        else {
          while (in_stack_fffffffffffffe1f =
                      Tokens::operator_cast_to_bool((Tokens *)in_stack_fffffffffffffe20.container),
                (bool)in_stack_fffffffffffffe1f) {
            Tokens::pop_abi_cxx11_((Tokens *)in_stack_fffffffffffffe28.container);
            std::make_shared<docopt::Argument,char_const(&)[1],std::__cxx11::string>
                      ((char (*) [1])CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe40._M_current);
            std::
            vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
            ::emplace_back<std::shared_ptr<docopt::Argument>>
                      ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                       (shared_ptr<docopt::Argument> *)in_stack_fffffffffffffe28.container);
            std::shared_ptr<docopt::Argument>::~shared_ptr((shared_ptr<docopt::Argument> *)0x2ba343)
            ;
            std::__cxx11::string::~string(local_140);
          }
        }
      }
      else {
        parse_long(in_stack_000002a8,in_stack_000002a0);
        local_98 = local_b0;
        local_b8 = (shared_ptr<docopt::Pattern> *)
                   std::
                   vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ::begin((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                            *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        local_c0 = (shared_ptr<docopt::Pattern> *)
                   std::
                   vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ::end((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        in_stack_fffffffffffffe40._M_current =
             (shared_ptr<docopt::Pattern> *)
             std::
             back_inserter<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                       ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                         *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
        __first._M_current._7_1_ = in_stack_fffffffffffffe4f;
        __first._M_current._0_7_ = in_stack_fffffffffffffe48;
        local_c8 = in_stack_fffffffffffffe40._M_current;
        in_stack_fffffffffffffe38 =
             std::
             move<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,std::back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                       (__first,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        local_d0 = (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)in_stack_fffffffffffffe38;
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
      }
    }
  }
  return in_RDI;
}

Assistant:

PatternList parse_argv(Tokens tokens, std::vector<Option>& options, bool options_first)
{
	// Parse command-line argument vector.
	//
	// If options_first:
	//    argv ::= [ long | shorts ]* [ argument ]* [ '--' [ argument ]* ] ;
	// else:
	//    argv ::= [ long | shorts | argument ]* [ '--' [ argument ]* ] ;
	
	PatternList ret;
	while (tokens) {
		auto const& token = tokens.current();
		
		if (token=="--") {
			// option list is done; convert all the rest to arguments
			while (tokens) {
				ret.emplace_back(std::make_shared<Argument>("", tokens.pop()));
			}
		} else if (starts_with(token, "--")) {
			auto&& parsed = parse_long(tokens, options);
			std::move(parsed.begin(), parsed.end(), std::back_inserter(ret));
		} else if (token[0]=='-' && token != "-") {
			auto&& parsed = parse_short(tokens, options);
			std::move(parsed.begin(), parsed.end(), std::back_inserter(ret));
		} else if (options_first) {
			// option list is done; convert all the rest to arguments
			while (tokens) {
				ret.emplace_back(std::make_shared<Argument>("", tokens.pop()));
			}
		} else {
			ret.emplace_back(std::make_shared<Argument>("", tokens.pop()));
		}
	}
	
	return ret;
}